

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleFilterCols_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  int iVar1;
  uint uVar2;
  int b_1;
  int a_1;
  int xi_1;
  int b;
  int a;
  int xi;
  int j;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_ptr_local;
  uint8_t *dst_ptr_local;
  
  x_local = x;
  dst_ptr_local = dst_ptr;
  for (j = 0; iVar1 = x_local >> 0x10, j < dst_width + -1; j = j + 2) {
    *dst_ptr_local =
         src_ptr[iVar1] +
         (char)((int)(((int)(x_local & 0xffffU) >> 9) *
                      ((uint)src_ptr[iVar1 + 1] - (uint)src_ptr[iVar1]) + 0x40) >> 7);
    uVar2 = dx + x_local;
    dst_ptr_local[1] =
         src_ptr[(int)uVar2 >> 0x10] +
         (char)((int)(((int)(uVar2 & 0xffff) >> 9) *
                      ((uint)src_ptr[((int)uVar2 >> 0x10) + 1] - (uint)src_ptr[(int)uVar2 >> 0x10])
                     + 0x40) >> 7);
    x_local = dx + uVar2;
    dst_ptr_local = dst_ptr_local + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr_local =
         src_ptr[iVar1] +
         (char)((int)(((int)(x_local & 0xffffU) >> 9) *
                      ((uint)src_ptr[iVar1 + 1] - (uint)src_ptr[iVar1]) + 0x40) >> 7);
  }
  return;
}

Assistant:

void ScaleFilterCols_C(uint8_t* dst_ptr,
                       const uint8_t* src_ptr,
                       int dst_width,
                       int x,
                       int dx) {
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}